

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_storage.cpp
# Opt level: O3

void __thiscall
duckdb::LocalStorage::FetchChunk
          (LocalStorage *this,DataTable *table,Vector *row_ids,idx_t count,
          vector<duckdb::StorageIndex,_true> *col_ids,DataChunk *chunk,ColumnFetchState *fetch_state
          )

{
  TransactionData transaction;
  RowGroupCollection *this_00;
  InternalException *this_01;
  optional_ptr<duckdb::LocalTableStorage,_true> storage;
  optional_ptr<duckdb::LocalTableStorage,_true> local_70;
  string local_68;
  TransactionData local_48;
  
  local_70 = LocalTableManager::GetStorage(&this->table_manager,table);
  if (local_70.ptr != (LocalTableStorage *)0x0) {
    optional_ptr<duckdb::LocalTableStorage,_true>::CheckValid(&local_70);
    this_00 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&(local_70.ptr)->row_groups);
    TransactionData::TransactionData(&local_48,this->transaction);
    transaction.transaction_id = local_48.transaction_id;
    transaction.transaction.ptr = local_48.transaction.ptr;
    transaction.start_time = local_48.start_time;
    RowGroupCollection::Fetch(this_00,transaction,chunk,col_ids,row_ids,count,fetch_state);
    return;
  }
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"LocalStorage::FetchChunk - local storage not found","");
  InternalException::InternalException(this_01,&local_68);
  __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void LocalStorage::FetchChunk(DataTable &table, Vector &row_ids, idx_t count, const vector<StorageIndex> &col_ids,
                              DataChunk &chunk, ColumnFetchState &fetch_state) {
	auto storage = table_manager.GetStorage(table);
	if (!storage) {
		throw InternalException("LocalStorage::FetchChunk - local storage not found");
	}

	storage->row_groups->Fetch(transaction, chunk, col_ids, row_ids, count, fetch_state);
}